

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O3

string * QPDFSystemError::createWhat
                   (string *__return_storage_ptr__,string *description,int system_errno)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (description->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + description->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  strerror(system_errno);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_38 = *plVar3;
    lStack_30 = plVar2[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
    local_48 = (long *)*plVar2;
  }
  local_40 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFSystemError::createWhat(std::string const& description, int system_errno)
{
    std::string message;
#ifdef _MSC_VER
    // "94" is mentioned in the MSVC docs, but it's still safe if the
    // message is longer.  strerror_s is a templated function that
    // knows the size of buf and truncates.
    char buf[94];
    if (strerror_s(buf, system_errno) != 0) {
        message = description + ": failed with an unknown error";
    } else {
        message = description + ": " + buf;
    }
#else
    message = description + ": " + strerror(system_errno);
#endif
    return message;
}